

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

void P_SetSafeFlash(AWeapon *weapon,player_t *player,FState *flashstate,int index)

{
  FState *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  PClassActor *pPVar4;
  DPSprite *this;
  FState *newstate;
  PClass *pPVar3;
  
  if (flashstate != (FState *)0x0) {
    pPVar3 = (weapon->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
             super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(weapon->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                 super_DObject._vptr_DObject)(weapon);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (weapon->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
      Class = pPVar3;
    }
    for (; pPVar3 != AWeapon::RegistrationInfo.MyClass; pPVar3 = pPVar3->ParentClass) {
      pFVar1 = *(FState **)
                &pPVar3[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
                 super_PType.super_PTypeBase.super_DObject;
      if ((pFVar1 <= flashstate) &&
         (pFVar1 = pFVar1 + *(int *)&pPVar3[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                                     super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
                                     GCNext, flashstate < pFVar1)) {
        newstate = flashstate + index;
        if (pFVar1 <= newstate) {
          newstate = flashstate;
          if (player == (player_t *)0x0) {
            return;
          }
          goto LAB_0043a25a;
        }
        if (player == (player_t *)0x0) {
          return;
        }
        this = player_t::GetPSprite(player,PSP_FLASH);
        goto LAB_0043a26d;
      }
    }
    pPVar4 = FState::StaticFindStateOwner(flashstate + index);
    if (pPVar4 == (PClassActor *)0x0) {
      index = 0;
    }
  }
  if (player == (player_t *)0x0) {
    return;
  }
  newstate = flashstate + index;
LAB_0043a25a:
  this = player_t::GetPSprite(player,PSP_FLASH);
LAB_0043a26d:
  DPSprite::SetState(this,newstate,true);
  return;
}

Assistant:

void P_SetSafeFlash(AWeapon *weapon, player_t *player, FState *flashstate, int index)
{
	if (flashstate != nullptr)
	{
		PClassActor *cls = weapon->GetClass();
		while (cls != RUNTIME_CLASS(AWeapon))
		{
			if (flashstate >= cls->OwnedStates && flashstate < cls->OwnedStates + cls->NumOwnedStates)
			{
				// The flash state belongs to this class.
				// Now let's check if the actually wanted state does also
				if (flashstate + index < cls->OwnedStates + cls->NumOwnedStates)
				{
					// we're ok so set the state
					P_SetPsprite(player, PSP_FLASH, flashstate + index, true);
					return;
				}
				else
				{
					// oh, no! The state is beyond the end of the state table so use the original flash state.
					P_SetPsprite(player, PSP_FLASH, flashstate, true);
					return;
				}
			}
			// try again with parent class
			cls = static_cast<PClassActor *>(cls->ParentClass);
		}
		// if we get here the state doesn't seem to belong to any class in the inheritance chain
		// This can happen with Dehacked if the flash states are remapped. 
		// The only way to check this would be to go through all Dehacked modifiable actors, convert
		// their states into a single flat array and find the correct one.
		// Rather than that, just check to make sure it belongs to something.
		if (FState::StaticFindStateOwner(flashstate + index) == NULL)
		{ // Invalid state. With no index offset, it should at least be valid.
			index = 0;
		}
	}
	P_SetPsprite(player, PSP_FLASH, flashstate + index, true);
}